

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_Exp(FParser *this)

{
  double dVar1;
  
  if (0 < this->t_argc) {
    dVar1 = floatvalue(this->t_argv);
    dVar1 = c_exp(dVar1);
    (this->t_return).value.i = (int)(dVar1 * 65536.0);
    (this->t_return).type = 6;
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_Exp()
{
	if (CheckArgs(1))
	{
		t_return.setDouble(g_exp(floatvalue(t_argv[0])));
	}
}